

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  string *psVar1;
  ostream *poVar2;
  
  printOpenHeader(this,_name);
  poVar2 = (this->super_StreamingReporterBase).stream;
  psVar1 = getDots_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getDots() << "\n";
        }